

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddInv.c
# Opt level: O0

DdNode * cuddAddScalarInverseRecur(DdManager *dd,DdNode *f,DdNode *epsilon)

{
  DdManager *T;
  DdManager *E;
  DdManager *local_58;
  double local_50;
  double value;
  DdNode *res;
  DdNode *e;
  DdNode *t;
  DdNode *epsilon_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f->index == 0x7fffffff) {
    if (0.0 < (f->type).value || (f->type).value == 0.0) {
      local_50 = (f->type).value;
    }
    else {
      local_50 = -(double)(f->type).kids.T;
    }
    if ((epsilon->type).value <= local_50) {
      dd_local = (DdManager *)cuddUniqueConst(dd,1.0 / (f->type).value);
    }
    else {
      dd_local = (DdManager *)0x0;
    }
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup2(dd,Cudd_addScalarInverse,f,epsilon);
    if (dd_local == (DdManager *)0x0) {
      T = (DdManager *)cuddAddScalarInverseRecur(dd,(f->type).kids.T,epsilon);
      if (T == (DdManager *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + 1;
        E = (DdManager *)cuddAddScalarInverseRecur(dd,(f->type).kids.E,epsilon);
        if (E == (DdManager *)0x0) {
          Cudd_RecursiveDeref(dd,(DdNode *)T);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
          local_58 = T;
          if (T != E) {
            local_58 = (DdManager *)cuddUniqueInter(dd,f->index,(DdNode *)T,(DdNode *)E);
          }
          if (local_58 == (DdManager *)0x0) {
            Cudd_RecursiveDeref(dd,(DdNode *)T);
            Cudd_RecursiveDeref(dd,(DdNode *)E);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
            cuddCacheInsert2(dd,Cudd_addScalarInverse,f,epsilon,&local_58->sentinel);
            dd_local = local_58;
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddAddScalarInverseRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * epsilon)
{
    DdNode *t, *e, *res;
    CUDD_VALUE_TYPE value;

    statLine(dd);
    if (cuddIsConstant(f)) {
        if (ddAbs(cuddV(f)) < cuddV(epsilon)) return(NULL);
        value = 1.0 / cuddV(f);
        res = cuddUniqueConst(dd,value);
        return(res);
    }

    res = cuddCacheLookup2(dd,Cudd_addScalarInverse,f,epsilon);
    if (res != NULL) return(res);

    t = cuddAddScalarInverseRecur(dd,cuddT(f),epsilon);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddAddScalarInverseRecur(dd,cuddE(f),epsilon);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd, t);
        return(NULL);
    }
    cuddRef(e);

    res = (t == e) ? t : cuddUniqueInter(dd,(int)f->index,t,e);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, t);
        Cudd_RecursiveDeref(dd, e);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);

    cuddCacheInsert2(dd,Cudd_addScalarInverse,f,epsilon,res);

    return(res);

}